

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SERecurrentNode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  NodePtr pSVar1;
  NodePtr pSVar2;
  int iVar3;
  undefined4 extraout_var;
  dag_iterator itr;
  dag_iterator local_e0;
  dag_iterator local_88;
  SERecurrentNode *pSVar4;
  
  SENode::graph_begin(&local_88,node);
  SENode::graph_end(&local_e0,node);
  pSVar2 = local_88.current_;
  pSVar1 = local_e0.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_e0.parent_iterators_);
  if (pSVar2 != pSVar1) {
    do {
      iVar3 = (*(local_88.current_)->_vptr_SENode[6])();
      pSVar4 = (SERecurrentNode *)CONCAT44(extraout_var,iVar3);
      if ((pSVar4 != (SERecurrentNode *)0x0) && (pSVar4->loop_ == loop)) goto LAB_006019c7;
      TreeDFIterator<spvtools::opt::SENode>::operator++(&local_88);
      SENode::graph_end(&local_e0,node);
      pSVar2 = local_88.current_;
      pSVar1 = local_e0.current_;
      std::
      _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                      *)&local_e0.parent_iterators_);
    } while (pSVar2 != pSVar1);
  }
  pSVar4 = (SERecurrentNode *)0x0;
LAB_006019c7:
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_88.parent_iterators_);
  return pSVar4;
}

Assistant:

SERecurrentNode* ScalarEvolutionAnalysis::GetRecurrentTerm(SENode* node,
                                                           const Loop* loop) {
  for (auto itr = node->graph_begin(); itr != node->graph_end(); ++itr) {
    SERecurrentNode* rec = itr->AsSERecurrentNode();
    if (rec && rec->GetLoop() == loop) {
      return rec;
    }
  }
  return nullptr;
}